

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuilderTask.cpp
# Opt level: O2

void __thiscall
nigel::BuilderTask::printErrorLog
          (BuilderTask *this,
          list<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
          *notificationList,
          time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          startTime)

{
  uint uVar1;
  unsigned_long uVar2;
  long *plVar3;
  size_type sVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  bool bVar7;
  long lVar8;
  mapped_type *__rhs;
  char *pcVar9;
  size_t i;
  ulong uVar10;
  char cVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string *this_01;
  ulong uVar12;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  double local_1e0;
  unsigned_long local_1d8;
  unsigned_long local_1d0;
  string local_1c8;
  unsigned_long local_1a8;
  string local_1a0;
  map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_180;
  _List_node_base *local_178;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  String outStr;
  
  std::__cxx11::string::string((string *)&outStr,"",(allocator *)&local_200);
  lVar8 = std::chrono::_V2::system_clock::now();
  local_1e0 = (double)(lVar8 - (long)startTime.__d.__r) / 1000000000.0;
  local_180 = &this->notificationTexts;
  local_1d8 = 0;
  local_1d0 = 0;
  local_1a8 = 0;
  local_178 = (_List_node_base *)notificationList;
  do {
    uVar6 = local_1a8;
    uVar5 = local_1d0;
    uVar2 = local_1d8;
    notificationList =
         (list<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
          *)(((_List_base<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
               *)&((_List_node_base *)notificationList)->_M_next)->_M_impl)._M_node.
            super__List_node_base._M_next;
    if ((_List_node_base *)notificationList == local_178) {
      if (local_1a8 == 0) {
        if (local_1d0 == 0 && local_1d8 == 0) {
          std::__cxx11::to_string(&local_220,local_1e0);
          std::operator+(&local_240,"Successfully finished in ",&local_220);
          std::operator+(&local_200,&local_240," seconds. ");
          helper::log((helper *)&local_200,__x_02);
          std::__cxx11::string::~string((string *)&local_200);
          std::__cxx11::string::~string((string *)&local_240);
          this_01 = &local_220;
        }
        else {
          std::__cxx11::to_string(&local_130,0);
          std::operator+(&local_110,"Finshed with ",&local_130);
          std::operator+(&local_f0,&local_110," errors, ");
          std::__cxx11::to_string(&local_150,uVar5);
          std::operator+(&local_d0,&local_f0,&local_150);
          pcVar9 = " warnings";
          if (uVar5 == 1) {
            pcVar9 = " warning";
          }
          std::operator+(&local_b0,&local_d0,pcVar9);
          std::operator+(&local_90,&local_b0," and ");
          std::__cxx11::to_string(&local_170,uVar2);
          std::operator+(&local_1a0,&local_90,&local_170);
          pcVar9 = " improvements";
          if (uVar5 == 1) {
            pcVar9 = " improvement";
          }
          std::operator+(&local_1c8,&local_1a0,pcVar9);
          std::operator+(&local_220,&local_1c8," in ");
          std::__cxx11::to_string(&local_70,local_1e0);
          std::operator+(&local_240,&local_220,&local_70);
          std::operator+(&local_200,&local_240," seconds.");
          helper::log((helper *)&local_200,__x_01);
          std::__cxx11::string::~string((string *)&local_200);
          std::__cxx11::string::~string((string *)&local_240);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_220);
          std::__cxx11::string::~string((string *)&local_1c8);
          std::__cxx11::string::~string((string *)&local_1a0);
          std::__cxx11::string::~string((string *)&local_170);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_150);
          std::__cxx11::string::~string((string *)&local_f0);
          std::__cxx11::string::~string((string *)&local_110);
          this_01 = &local_130;
        }
      }
      else {
        std::__cxx11::to_string(&local_110,local_1a8);
        uVar5 = local_1d0;
        uVar2 = local_1d8;
        std::operator+(&local_f0,"FAILED ",&local_110);
        pcVar9 = " ERRORS";
        if (uVar6 == 1) {
          pcVar9 = " ERROR";
        }
        std::operator+(&local_d0,&local_f0,pcVar9);
        std::operator+(&local_b0,&local_d0," OCCURRED! ");
        std::__cxx11::to_string(&local_130,uVar5);
        std::operator+(&local_90,&local_b0,&local_130);
        std::operator+(&local_1a0,&local_90," warnings occurred. ");
        std::__cxx11::to_string(&local_150,uVar2);
        std::operator+(&local_1c8,&local_1a0,&local_150);
        std::operator+(&local_220,&local_1c8," improvements available. Took ");
        std::__cxx11::to_string(&local_170,local_1e0);
        std::operator+(&local_240,&local_220,&local_170);
        std::operator+(&local_200,&local_240," second");
        helper::log((helper *)&local_200,__x_00);
        std::__cxx11::string::~string((string *)&local_200);
        std::__cxx11::string::~string((string *)&local_240);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::~string((string *)&local_220);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_1a0);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_f0);
        this_01 = &local_110;
      }
      std::__cxx11::string::~string((string *)this_01);
      std::__cxx11::string::~string((string *)&outStr);
      return;
    }
    std::operator+(&local_200,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    ((long)((_List_node_base *)((long)notificationList + 0x10))->_M_next + 8),"(");
    std::__cxx11::string::operator=((string *)&outStr,(string *)&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    lVar8 = *(long *)((long)((_List_node_base *)((long)notificationList + 0x10))->_M_next + 0x28);
    if (lVar8 == 0) {
      uVar2 = *(unsigned_long *)
               ((long)((_List_node_base *)((long)notificationList + 0x10))->_M_next + 0x38);
      if (uVar2 != 0xffffffffffffffff) {
        std::__cxx11::to_string(&local_200,uVar2);
        std::__cxx11::string::append((string *)&outStr);
        this_00 = &local_200;
        goto LAB_001591c3;
      }
    }
    else {
      std::__cxx11::to_string(&local_220,*(unsigned_long *)(lVar8 + 0x20));
      std::operator+(&local_240,&local_220,", ");
      std::__cxx11::to_string
                (&local_1c8,
                 *(unsigned_long *)
                  (*(long *)((long)((_List_node_base *)((long)notificationList + 0x10))->_M_next +
                            0x28) + 0x28));
      std::operator+(&local_200,&local_240,&local_1c8);
      std::__cxx11::string::append((string *)&outStr);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_240);
      this_00 = &local_220;
LAB_001591c3:
      std::__cxx11::string::~string((string *)this_00);
    }
    std::__cxx11::string::append((char *)&outStr);
    uVar1 = *(uint *)((_List_node_base *)((long)notificationList + 0x10))->_M_next;
    if (0 < (int)uVar1) {
      if (uVar1 < 0x7fff) {
        std::__cxx11::string::append((char *)&outStr);
        local_1a8 = local_1a8 + 1;
      }
      else if (uVar1 != 0x7fff) {
        if (uVar1 < 0xffff) {
          std::__cxx11::string::append((char *)&outStr);
          local_1d0 = local_1d0 + 1;
        }
        else if (uVar1 < 0x10002 && uVar1 != 0xffff) {
          std::__cxx11::string::append((char *)&outStr);
          local_1d8 = local_1d8 + 1;
        }
      }
    }
    std::__cxx11::to_string
              (&local_1a0,
               (long)*(int *)((_List_node_base *)((long)notificationList + 0x10))->_M_next);
    std::operator+(&local_1c8," ",&local_1a0);
    std::operator+(&local_220,&local_1c8," \"");
    __rhs = std::
            map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](local_180,
                         (key_type *)((_List_node_base *)((long)notificationList + 0x10))->_M_next);
    std::operator+(&local_240,&local_220,__rhs);
    std::operator+(&local_200,&local_240,"\"");
    std::__cxx11::string::append((string *)&outStr);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_1c8);
    __x = (double)std::__cxx11::string::~string((string *)&local_1a0);
    lVar8 = (long)((_List_node_base *)((long)notificationList + 0x10))->_M_next;
    plVar3 = *(long **)(lVar8 + 0x28);
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 0x10))(&local_220,plVar3,0);
      std::operator+(&local_240," at token \'",&local_220);
      std::operator+(&local_200,&local_240,"\'");
      std::__cxx11::string::append((string *)&outStr);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::~string((string *)&local_240);
      __x = (double)std::__cxx11::string::~string((string *)&local_220);
      lVar8 = (long)((_List_node_base *)((long)notificationList + 0x10))->_M_next;
    }
    if (*(long *)(lVar8 + 0x18) != 0) {
      std::__cxx11::string::append((char *)&outStr);
      __x = (double)std::__cxx11::string::append((string *)&outStr);
      lVar8 = (long)((_List_node_base *)((long)notificationList + 0x10))->_M_next;
    }
    plVar3 = *(long **)(lVar8 + 0x28);
    if (plVar3 != (long *)0x0) {
      uVar12 = plVar3[5];
      (**(code **)(*plVar3 + 0x10))(&local_200,plVar3,0);
      bVar7 = std::operator==(&local_200,"_!EOF!_");
      std::__cxx11::string::~string((string *)&local_200);
      if (bVar7) {
        uVar12 = *(long *)(*(long *)((long)((_List_node_base *)((long)notificationList + 0x10))->
                                           _M_next + 0x18) + 8) + 1;
      }
      for (uVar10 = 1; cVar11 = (char)&outStr, uVar10 < uVar12; uVar10 = uVar10 + 1) {
        std::__cxx11::string::push_back(cVar11);
      }
      std::__cxx11::string::push_back(cVar11);
      plVar3 = *(long **)((long)((_List_node_base *)((long)notificationList + 0x10))->_M_next + 0x28
                         );
      (**(code **)(*plVar3 + 0x10))(&local_200,plVar3,0);
      bVar7 = std::operator!=(&local_200,"-!-UNKNOWN-!-");
      if (bVar7) {
        plVar3 = *(long **)((long)((_List_node_base *)((long)notificationList + 0x10))->_M_next +
                           0x28);
        (**(code **)(*plVar3 + 0x10))(&local_240,plVar3,0);
        bVar7 = std::operator!=(&local_240,"_!EOF!_");
        std::__cxx11::string::~string((string *)&local_240);
        __x = (double)std::__cxx11::string::~string((string *)&local_200);
        if (bVar7) {
          uVar12 = 1;
          while( true ) {
            plVar3 = *(long **)((long)((_List_node_base *)((long)notificationList + 0x10))->_M_next
                               + 0x28);
            (**(code **)(*plVar3 + 0x10))(&local_200,plVar3,0);
            sVar4 = local_200._M_string_length;
            __x = (double)std::__cxx11::string::~string((string *)&local_200);
            if (sVar4 <= uVar12) break;
            std::__cxx11::string::push_back(cVar11);
            uVar12 = uVar12 + 1;
          }
        }
      }
      else {
        __x = (double)std::__cxx11::string::~string((string *)&local_200);
      }
    }
    helper::log((helper *)&outStr,__x);
  } while( true );
}

Assistant:

void BuilderTask::printErrorLog( std::list<std::shared_ptr<CompileNotification>> notificationList, std::chrono::time_point<std::chrono::system_clock> startTime )
	{
		size_t errorCount = 0, warningCount = 0, notificationCount = 0;
		String outStr = "";
		LogLevel level = LogLevel::Information;

		std::chrono::time_point<std::chrono::system_clock> endTime = std::chrono::system_clock::now();
		std::chrono::duration<double> duration = ( endTime - startTime );

		for( auto &n : notificationList )
		{
			outStr = n->file->generic_string() + "(";
			if( n->token != nullptr ) outStr += to_string( n->token->lineNo ) + ", " + to_string( n->token->columnNo );
			else if( n->line != -1 ) outStr += to_string( n->line );
			outStr += "): ";

			if( n->type > NT::begin_err && n->type < NT::begin_warning )
			{//error
				outStr += "error";
				level = LogLevel::Error;
				errorCount++;
			}
			else if( n->type > NT::begin_warning && n->type < NT::begin_improvements )
			{//warning
				outStr += "warning";
				level = LogLevel::Warning;
				warningCount++;
			}
			else if( n->type > NT::begin_improvements && n->type < NT::count )
			{//notification
				outStr += "notification";
				level = LogLevel::Information;
				notificationCount++;
			}

			outStr += " " + to_string( n->getCode() ) + " \"" + notificationTexts[n->type] + "\"" ;
			if( n->token != nullptr ) outStr += " at token '" + n->token->toString() + "'";
			if( n->lineText != nullptr )
			{
				outStr += ": \n";
				outStr += *n->lineText;
			}

			if( n->token != nullptr )
			{
				size_t pos = n->token->columnNo;
				if( n->token->toString() == "_!EOF!_" ) pos = n->lineText->size() + 1;

				for( size_t i = 1 ; i < pos ; i++ ) outStr += ' ';

				outStr += '^';
				if( n->token->toString() != "-!-UNKNOWN-!-" &&
					n->token->toString() != "_!EOF!_" ) 
					for( size_t i = 1 ; i < n->token->toString().size() ; i++ ) outStr += '~';
			}

			log( outStr, level );
		}
		if( errorCount > 0 )
		{
			log( "FAILED " + to_string( errorCount ) + ( errorCount > 1 ? " ERRORS" : " ERROR" ) + " OCCURRED! " + to_string( warningCount ) + " warnings occurred. " + to_string( notificationCount ) + " improvements available. Took " + to_string( duration.count() ) + " second" );
		}
		else if( warningCount > 0 || notificationCount > 0 )
		{
			log( "Finshed with " + to_string( errorCount ) + " errors, " + to_string( warningCount ) + ( warningCount == 1 ? " warning" : " warnings" ) + " and " + to_string( notificationCount ) + ( warningCount == 1 ? " improvement" : " improvements" ) + " in " + to_string( duration.count() ) + " seconds." );
		}
		else log( "Successfully finished in " + to_string( duration.count() ) + " seconds. " );
	}